

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O1

FT_Bool tt_check_trickyness(FT_Face face)

{
  char *__haystack;
  code *pcVar1;
  FT_Stream stream;
  byte bVar2;
  int iVar3;
  FT_Error FVar4;
  char *pcVar5;
  FT_ULong FVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  int local_98 [26];
  
  if (face == (FT_Face)0x0) {
    return '\0';
  }
  __haystack = face->family_name;
  if (__haystack != (char *)0x0) {
    lVar8 = 0;
    do {
      pcVar5 = strstr(__haystack,&tt_check_trickyness_family_trick_names + lVar8);
      if (pcVar5 != (char *)0x0) break;
      bVar14 = lVar8 != 0x1b8;
      lVar8 = lVar8 + 0x14;
    } while (bVar14);
    if (pcVar5 != (char *)0x0) {
      return '\x01';
    }
  }
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  if (*(short *)&face[1].family_name == 0) {
    bVar14 = true;
  }
  else {
    uVar10 = 0;
    bVar14 = false;
    do {
      lVar11 = uVar10 * 0x20;
      lVar8 = *(long *)(face[1].style_name + lVar11);
      if (lVar8 == 0x63767420) {
        bVar14 = true;
        iVar13 = 0;
LAB_0017483e:
        lVar8 = 0;
        uVar7 = 0;
        do {
          if (*(long *)(face[1].style_name + lVar11 + 0x18) ==
              *(long *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                       (ulong)(uint)(iVar13 << 4) + 8 + lVar8 * 0x30)) {
            if (uVar7 == 0) {
              pcVar1 = (code *)face[3].generic.data;
              if (pcVar1 == (code *)0x0) {
                uVar7 = 0;
              }
              else {
                iVar3 = (*pcVar1)(face,*(undefined8 *)(face[1].style_name + lVar11),face->stream,0);
                uVar7 = 0;
                if (iVar3 == 0) {
                  stream = face->stream;
                  uVar7 = *(ulong *)(face[1].style_name + lVar11 + 0x18);
                  FVar4 = FT_Stream_EnterFrame(stream,uVar7);
                  if (FVar4 == 0) {
                    uVar12 = 0;
                    if (3 < uVar7) {
                      uVar12 = 0;
                      do {
                        FVar6 = FT_Stream_GetULong(stream);
                        uVar12 = uVar12 + (int)FVar6;
                        uVar7 = uVar7 - 4;
                      } while (3 < uVar7);
                    }
                    if (uVar7 != 0) {
                      bVar9 = 0x18;
                      do {
                        bVar2 = FT_Stream_GetChar(stream);
                        uVar12 = uVar12 + ((uint)bVar2 << (bVar9 & 0x1f));
                        bVar9 = bVar9 - 8;
                        uVar7 = uVar7 - 1;
                      } while (uVar7 != 0);
                    }
                    FT_Stream_ExitFrame(stream);
                    uVar7 = (ulong)uVar12;
                  }
                  else {
                    uVar7 = 0;
                  }
                }
              }
            }
            if (*(ulong *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                          (ulong)(uint)(iVar13 << 4) + lVar8 * 0x30) == uVar7) {
              local_98[lVar8] = local_98[lVar8] + 1;
            }
            if (local_98[lVar8] == 3) {
              return '\x01';
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1a);
      }
      else {
        if (lVar8 == 0x70726570) {
          iVar13 = 2;
          goto LAB_0017483e;
        }
        if (lVar8 == 0x6670676d) {
          iVar13 = 1;
          goto LAB_0017483e;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(ushort *)&face[1].family_name);
    bVar14 = !bVar14;
  }
  uVar10 = 0xfffffffffffffff3;
  while( true ) {
    if ((bool)(uVar10 < 0xc & bVar14)) {
      local_98[uVar10 + 0xd] = local_98[uVar10 + 0xd] + 1;
    }
    if (local_98[uVar10 + 0xd] == 3) break;
    uVar10 = uVar10 + 1;
    if (uVar10 == 0xd) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static FT_Bool
  tt_check_trickyness( FT_Face  face )
  {
    if ( !face )
      return FALSE;

    /* For first, check the face name for quick check. */
    if ( face->family_name                               &&
         tt_check_trickyness_family( face->family_name ) )
      return TRUE;

    /* Type42 fonts may lack `name' tables, we thus try to identify */
    /* tricky fonts by checking the checksums of Type42-persistent  */
    /* sfnt tables (`cvt', `fpgm', and `prep').                     */
    if ( tt_check_trickyness_sfnt_ids( (TT_Face)face ) )
      return TRUE;

    return FALSE;
  }